

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O0

void __thiscall TextReader::parse_hex(TextReader *this)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  TextReader *local_10;
  TextReader *this_local;
  
  this->current_token_len_ = this->current_token_len_ + 1;
  this->current_token_len_ = this->current_token_len_ + 1;
  local_10 = this;
  do {
    sVar1 = this->current_token_pos_;
    sVar2 = this->current_token_len_;
    uVar4 = std::__cxx11::string::size();
    bVar3 = false;
    if (sVar1 + sVar2 < uVar4) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_);
      if ('/' < *pcVar5) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_);
        bVar3 = true;
        if (*pcVar5 < ':') goto LAB_0011a455;
      }
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_);
      if ('@' < *pcVar5) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_);
        bVar3 = true;
        if (*pcVar5 < 'G') goto LAB_0011a455;
      }
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_);
      bVar3 = false;
      if ('`' < *pcVar5) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_);
        bVar3 = *pcVar5 < 'g';
      }
    }
LAB_0011a455:
    if (!bVar3) {
      sVar1 = this->current_token_pos_;
      sVar2 = this->current_token_len_;
      uVar4 = std::__cxx11::string::size();
      if ((sVar1 + sVar2 < uVar4) &&
         ((((pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
            '/' < *pcVar5 &&
            (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
            *pcVar5 < ':')) ||
           ((pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
            '@' < *pcVar5 &&
            (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
            *pcVar5 < '[')))) ||
          (((pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
            '`' < *pcVar5 &&
            (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
            *pcVar5 < '{')) ||
           (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
           *pcVar5 == '_')))))) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_30,"Invalid symbol in hexadecimal value",&local_31);
        parse_error(this,(string *)local_30);
        std::__cxx11::string::~string(local_30);
        std::allocator<char>::~allocator((allocator<char> *)&local_31);
      }
      else if (this->current_token_len_ == 2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_68,"Hexadecimal value prefix specified without the value",&local_69);
        parse_error(this,(string *)local_68);
        std::__cxx11::string::~string(local_68);
        std::allocator<char>::~allocator((allocator<char> *)&local_69);
      }
      return;
    }
    this->current_token_len_ = this->current_token_len_ + 1;
  } while( true );
}

Assistant:

inline void parse_hex() {
        current_token_len_++;
        current_token_len_++;
        while (current_token_pos_ + current_token_len_ < current_line_.size() &&
               _is_hex_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            current_token_len_++;
        };
        if (current_token_pos_ + current_token_len_ < current_line_.size() &&
            _is_literal_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            parse_error(ERROR_HEX_INVALID_SYMBOL);
        } else if (current_token_len_ == 2) {
            parse_error(ERROR_MISSING_HEX_VALUE);
        };
    }